

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall jsonnet::internal::CompilerPass::visit(CompilerPass *this,Index *ast)

{
  long in_RSI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI + 0x80);
  if (*(long *)(in_RSI + 0x108) == 0) {
    if ((*(byte *)(in_RSI + 0xa0) & 1) == 0) {
      (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI + 0xa8);
    }
    else {
      if (*(long *)(in_RSI + 0xa8) != 0) {
        (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI + 0xa8);
      }
      if (*(long *)(in_RSI + 200) != 0) {
        (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI + 200);
      }
      if (*(long *)(in_RSI + 0xe8) != 0) {
        (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI + 0xe8);
      }
    }
  }
  return;
}

Assistant:

void CompilerPass::visit(Index *ast)
{
    expr(ast->target);
    if (ast->id != nullptr) {
    } else {
        if (ast->isSlice) {
            if (ast->index != nullptr)
                expr(ast->index);
            if (ast->end != nullptr)
                expr(ast->end);
            if (ast->step != nullptr)
                expr(ast->step);
        } else {
            expr(ast->index);
        }
    }
}